

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JtagAnalyzer.cpp
# Opt level: O0

void __thiscall
JtagAnalyzer::CloseFrameV2
          (JtagAnalyzer *this,Frame *frm,JtagShiftedData *shifted_data,U64 ending_sample_number)

{
  pointer *this_00;
  JtagTAPState mCurrTAPState;
  size_type sVar1;
  reference pvVar2;
  pointer puVar3;
  char *pcVar4;
  element_type *peVar5;
  char *type;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  size_t max_bit_count;
  FrameV2 frame_v2;
  undefined1 local_60 [8];
  JtagShiftedData corrected_shifted_data;
  U64 ending_sample_number_local;
  JtagShiftedData *shifted_data_local;
  Frame *frm_local;
  JtagAnalyzer *this_local;
  
  corrected_shifted_data.mTdoBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ending_sample_number;
  JtagShiftedData::JtagShiftedData((JtagShiftedData *)local_60);
  CloseFrame(this,frm,shifted_data,
             (U64)corrected_shifted_data.mTdoBits.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(JtagShiftedData *)local_60);
  FrameV2::FrameV2((FrameV2 *)&max_bit_count);
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &corrected_shifted_data);
  if (sVar1 != 0) {
    BitsToBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                &data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,
                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&corrected_shifted_data);
    this_00 = &data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
    FrameV2::AddByteArray((char *)&max_bit_count,(uchar *)"TDI",(ulonglong)pvVar2);
    sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &corrected_shifted_data);
    if (sVar1 != 0) {
      data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               &corrected_shifted_data);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &data_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &corrected_shifted_data.mTdiBits.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  if (sVar1 != 0) {
    BitsToBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&type,
                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                &corrected_shifted_data.mTdiBits.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
    pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&type,0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&type);
    FrameV2::AddByteArray((char *)&max_bit_count,"TDO",(ulonglong)pvVar2);
    puVar3 = (pointer)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 &corrected_shifted_data.mTdiBits.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage < puVar3) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &corrected_shifted_data.mTdiBits.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&type);
  }
  FrameV2::AddInteger((char *)&max_bit_count,0x11c179);
  mCurrTAPState = JtagTAP_Controller::GetCurrState(&this->mTAPCtrl);
  pcVar4 = JtagAnalyzerResults::GetStateDescShort(mCurrTAPState);
  peVar5 = std::auto_ptr<JtagAnalyzerResults>::operator->(&this->mResults);
  AnalyzerResults::AddFrameV2
            ((FrameV2 *)peVar5,(char *)&max_bit_count,(ulonglong)pcVar4,*(ulonglong *)frm);
  FrameV2::~FrameV2((FrameV2 *)&max_bit_count);
  JtagShiftedData::~JtagShiftedData((JtagShiftedData *)local_60);
  return;
}

Assistant:

void JtagAnalyzer::CloseFrameV2( Frame& frm, JtagShiftedData& shifted_data, U64 ending_sample_number )
{
    JtagShiftedData corrected_shifted_data;

    CloseFrame( frm, shifted_data, ending_sample_number, &corrected_shifted_data );

    FrameV2 frame_v2;

    size_t max_bit_count = 0;

    if( corrected_shifted_data.mTdiBits.size() > 0 )
    {
        std::vector<U8> data = BitsToBytes( corrected_shifted_data.mTdiBits );

        frame_v2.AddByteArray( "TDI", &data[ 0 ], data.size() );

        if( max_bit_count < corrected_shifted_data.mTdiBits.size() )
        {
            max_bit_count = corrected_shifted_data.mTdiBits.size();
        }
    }

    if( corrected_shifted_data.mTdoBits.size() > 0 )
    {
        std::vector<U8> data = BitsToBytes( corrected_shifted_data.mTdoBits );

        frame_v2.AddByteArray( "TDO", &data[ 0 ], data.size() );

        if( max_bit_count < corrected_shifted_data.mTdoBits.size() )
        {
            max_bit_count = corrected_shifted_data.mTdoBits.size();
        }
    }

    frame_v2.AddInteger( "BitCount", max_bit_count );

    const char* type = JtagAnalyzerResults::GetStateDescShort( mTAPCtrl.GetCurrState() );

    mResults->AddFrameV2( frame_v2, type, frm.mStartingSampleInclusive, frm.mEndingSampleInclusive );
}